

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jctrans.c
# Opt level: O1

boolean compress_output(j_compress_ptr cinfo,JSAMPIMAGE input_buf)

{
  JDIMENSION JVar1;
  JDIMENSION JVar2;
  JDIMENSION JVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  jpeg_c_coef_controller *pjVar8;
  jpeg_component_info *pjVar9;
  int iVar10;
  int iVar11;
  boolean bVar12;
  uint uVar13;
  JBLOCKARRAY ppaJVar14;
  JBLOCKROW paJVar15;
  long lVar16;
  int iVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  JBLOCKARRAY buffer [4];
  JBLOCKROW MCU_buffer [10];
  long alStack_a8 [4];
  JBLOCKROW local_88 [11];
  
  pjVar8 = cinfo->coef;
  JVar1 = cinfo->total_iMCU_rows;
  JVar2 = cinfo->MCUs_per_row;
  if (0 < cinfo->comps_in_scan) {
    lVar19 = 0;
    do {
      JVar3 = cinfo->cur_comp_info[lVar19]->v_samp_factor;
      ppaJVar14 = (*cinfo->mem->access_virt_barray)
                            ((j_common_ptr)cinfo,
                             *(jvirt_barray_ptr *)
                              (pjVar8[2].start_pass +
                              (long)cinfo->cur_comp_info[lVar19]->component_index * 8),
                             *(int *)&pjVar8[1].start_pass * JVar3,JVar3,0);
      alStack_a8[lVar19] = (long)ppaJVar14;
      lVar19 = lVar19 + 1;
    } while (lVar19 < cinfo->comps_in_scan);
  }
  lVar19 = (long)*(int *)&pjVar8[1].compress_data;
  if (*(int *)&pjVar8[1].compress_data < *(int *)((long)&pjVar8[1].compress_data + 4)) {
    do {
      for (uVar13 = *(uint *)((long)&pjVar8[1].start_pass + 4); uVar13 < cinfo->MCUs_per_row;
          uVar13 = uVar13 + 1) {
        iVar4 = cinfo->comps_in_scan;
        if (0 < (long)iVar4) {
          lVar16 = 0;
          iVar17 = 0;
          do {
            pjVar9 = cinfo->cur_comp_info[lVar16];
            iVar5 = pjVar9->MCU_width;
            iVar10 = iVar5;
            if (JVar2 - 1 <= uVar13) {
              iVar10 = pjVar9->last_col_width;
            }
            iVar6 = pjVar9->MCU_height;
            if (0 < (long)iVar6) {
              uVar7 = *(uint *)&pjVar8[1].start_pass;
              lVar18 = 0;
              do {
                if (uVar7 < JVar1 - 1) {
                  if (iVar10 < 1) {
                    iVar11 = 0;
                  }
                  else {
LAB_0010cdf1:
                    paJVar15 = (JBLOCKROW)
                               (*(long *)(lVar18 * 8 + alStack_a8[lVar16] + lVar19 * 8) +
                               (ulong)(iVar5 * uVar13) * 0x80);
                    lVar20 = 0;
                    do {
                      local_88[iVar17 + lVar20] = paJVar15;
                      paJVar15 = paJVar15 + 1;
                      lVar20 = lVar20 + 1;
                    } while (iVar10 != (int)lVar20);
                    iVar17 = iVar17 + (int)lVar20;
                    iVar11 = iVar10;
                  }
                }
                else {
                  iVar11 = 0;
                  if ((lVar18 + lVar19 < (long)pjVar9->last_row_height) && (iVar11 = 0, 0 < iVar10))
                  goto LAB_0010cdf1;
                }
                if (iVar11 < iVar5) {
                  lVar20 = 0;
                  do {
                    paJVar15 = (JBLOCKROW)(&pjVar8[2].compress_data)[iVar17 + lVar20];
                    local_88[iVar17 + lVar20] = paJVar15;
                    (*paJVar15)[0] = *(JCOEF *)alStack_a8[(long)iVar17 + lVar20 + 3];
                    lVar20 = lVar20 + 1;
                  } while (iVar5 - iVar11 != (int)lVar20);
                  iVar17 = iVar17 + (int)lVar20;
                }
                lVar18 = lVar18 + 1;
              } while (lVar18 != iVar6);
            }
            lVar16 = lVar16 + 1;
          } while (lVar16 != iVar4);
        }
        bVar12 = (*cinfo->entropy->encode_mcu)(cinfo,local_88);
        if (bVar12 == 0) {
          *(int *)&pjVar8[1].compress_data = (int)lVar19;
          *(uint *)((long)&pjVar8[1].start_pass + 4) = uVar13;
          return 0;
        }
      }
      *(undefined4 *)((long)&pjVar8[1].start_pass + 4) = 0;
      lVar19 = lVar19 + 1;
    } while (lVar19 < *(int *)((long)&pjVar8[1].compress_data + 4));
  }
  *(int *)&pjVar8[1].start_pass = *(int *)&pjVar8[1].start_pass + 1;
  start_iMCU_row(cinfo);
  return 1;
}

Assistant:

METHODDEF(boolean)
compress_output (j_compress_ptr cinfo, JSAMPIMAGE input_buf)
{
  my_coef_ptr coef = (my_coef_ptr) cinfo->coef;
  JDIMENSION MCU_col_num;	/* index of current MCU within row */
  JDIMENSION last_MCU_col = cinfo->MCUs_per_row - 1;
  JDIMENSION last_iMCU_row = cinfo->total_iMCU_rows - 1;
  int blkn, ci, xindex, yindex, yoffset, blockcnt;
  JDIMENSION start_col;
  JBLOCKARRAY buffer[MAX_COMPS_IN_SCAN];
  JBLOCKROW MCU_buffer[C_MAX_BLOCKS_IN_MCU];
  JBLOCKROW buffer_ptr;
  jpeg_component_info *compptr;

  /* Align the virtual buffers for the components used in this scan. */
  for (ci = 0; ci < cinfo->comps_in_scan; ci++) {
    compptr = cinfo->cur_comp_info[ci];
    buffer[ci] = (*cinfo->mem->access_virt_barray)
      ((j_common_ptr) cinfo, coef->whole_image[compptr->component_index],
       coef->iMCU_row_num * compptr->v_samp_factor,
       (JDIMENSION) compptr->v_samp_factor, FALSE);
  }

  /* Loop to process one whole iMCU row */
  for (yoffset = coef->MCU_vert_offset; yoffset < coef->MCU_rows_per_iMCU_row;
       yoffset++) {
    for (MCU_col_num = coef->mcu_ctr; MCU_col_num < cinfo->MCUs_per_row;
	 MCU_col_num++) {
      /* Construct list of pointers to DCT blocks belonging to this MCU */
      blkn = 0;			/* index of current DCT block within MCU */
      for (ci = 0; ci < cinfo->comps_in_scan; ci++) {
	compptr = cinfo->cur_comp_info[ci];
	start_col = MCU_col_num * compptr->MCU_width;
	blockcnt = (MCU_col_num < last_MCU_col) ? compptr->MCU_width
						: compptr->last_col_width;
	for (yindex = 0; yindex < compptr->MCU_height; yindex++) {
	  if (coef->iMCU_row_num < last_iMCU_row ||
	      yindex+yoffset < compptr->last_row_height) {
	    /* Fill in pointers to real blocks in this row */
	    buffer_ptr = buffer[ci][yindex+yoffset] + start_col;
	    for (xindex = 0; xindex < blockcnt; xindex++)
	      MCU_buffer[blkn++] = buffer_ptr++;
	  } else {
	    /* At bottom of image, need a whole row of dummy blocks */
	    xindex = 0;
	  }
	  /* Fill in any dummy blocks needed in this row.
	   * Dummy blocks are filled in the same way as in jccoefct.c:
	   * all zeroes in the AC entries, DC entries equal to previous
	   * block's DC value.  The init routine has already zeroed the
	   * AC entries, so we need only set the DC entries correctly.
	   */
	  for (; xindex < compptr->MCU_width; xindex++) {
	    MCU_buffer[blkn] = coef->dummy_buffer[blkn];
	    MCU_buffer[blkn][0][0] = MCU_buffer[blkn-1][0][0];
	    blkn++;
	  }
	}
      }
      /* Try to write the MCU. */
      if (! (*cinfo->entropy->encode_mcu) (cinfo, MCU_buffer)) {
	/* Suspension forced; update state counters and exit */
	coef->MCU_vert_offset = yoffset;
	coef->mcu_ctr = MCU_col_num;
	return FALSE;
      }
    }
    /* Completed an MCU row, but perhaps not an iMCU row */
    coef->mcu_ctr = 0;
  }
  /* Completed the iMCU row, advance counters for next one */
  coef->iMCU_row_num++;
  start_iMCU_row(cinfo);
  return TRUE;
}